

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewFuncStart(LocationUpdater *this,BinaryLocation oldAddr)

{
  ulong uVar1;
  bool bVar2;
  Function *pFVar3;
  BinaryLocation BVar4;
  BinaryLocation extraout_EDX;
  BinaryLocation BVar5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  
  pFVar3 = FuncAddrMap::getStart(&this->oldFuncAddrMap,oldAddr);
  if (pFVar3 == (Function *)0x0) {
    bVar2 = false;
    BVar5 = extraout_EDX;
  }
  else {
    uVar1 = (this->newLocations->functions)._M_h._M_bucket_count;
    uVar6 = (ulong)pFVar3 % uVar1;
    p_Var8 = (this->newLocations->functions)._M_h._M_buckets[uVar6];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var7 = p_Var8->_M_nxt, p_Var9 = p_Var8, pFVar3 != (Function *)p_Var8->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var7, p_Var7 = p_Var8->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var7[1]._M_nxt % uVar1 != uVar6) ||
           (p_Var9 = p_Var8, pFVar3 == (Function *)p_Var7[1]._M_nxt)) goto LAB_00c902f6;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_00c902f6:
    if (p_Var9 == (__node_base_ptr)0x0) {
      p_Var7 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var7 = p_Var9->_M_nxt;
    }
    bVar2 = p_Var7 != (_Hash_node_base *)0x0;
    if (p_Var7 == (_Hash_node_base *)0x0) {
      BVar5 = 0;
    }
    else if ((pFVar3->funcLocation).start == oldAddr) {
      BVar5 = *(BinaryLocation *)&p_Var7[2]._M_nxt;
    }
    else {
      if ((pFVar3->funcLocation).declarations != oldAddr) {
        handle_unreachable("invalid func start",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                           ,0x224);
      }
      BVar5 = *(BinaryLocation *)((long)&p_Var7[2]._M_nxt + 4);
    }
  }
  BVar4 = 0;
  if (bVar2) {
    BVar4 = BVar5;
  }
  return BVar4;
}

Assistant:

BinaryLocation getNewFuncStart(BinaryLocation oldAddr) const {
    if (auto* func = oldFuncAddrMap.getStart(oldAddr)) {
      // The function might have been optimized away, check.
      auto iter = newLocations.functions.find(func);
      if (iter != newLocations.functions.end()) {
        auto oldLocations = func->funcLocation;
        auto newLocations = iter->second;
        if (oldAddr == oldLocations.start) {
          return newLocations.start;
        } else if (oldAddr == oldLocations.declarations) {
          return newLocations.declarations;
        } else {
          WASM_UNREACHABLE("invalid func start");
        }
      }
    }
    return 0;
  }